

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTree.cpp
# Opt level: O2

bool __thiscall CASC_FILE_TREE::RebuildTreeMaps(CASC_FILE_TREE *this)

{
  int iVar1;
  size_t MaxItems;
  uint in_EAX;
  PCASC_MAP p_Var2;
  void *pvNewObject;
  size_t i;
  ulong ItemIndex;
  bool bVar3;
  undefined4 uStack_28;
  DWORD DataId;
  
  MaxItems = (this->FileTable).m_ItemCountMax;
  _uStack_28 = (ulong)in_EAX;
  if (this->pNameMap != (PCASC_MAP)0x0) {
    Map_Free(this->pNameMap);
  }
  this->pNameMap = (PCASC_MAP)0x0;
  if (this->pIdMap != (PCASC_MAP)0x0) {
    Map_Free(this->pIdMap);
  }
  this->pIdMap = (PCASC_MAP)0x0;
  p_Var2 = Map_Create(MaxItems,8,0x10);
  this->pNameMap = p_Var2;
  if (p_Var2 == (PCASC_MAP)0x0) {
LAB_0010fdd8:
    bVar3 = false;
  }
  else {
    if (this->DataIdOffset != 0) {
      p_Var2 = Map_Create(MaxItems,4,this->DataIdOffset);
      this->pIdMap = p_Var2;
      if (p_Var2 == (PCASC_MAP)0x0) goto LAB_0010fdd8;
    }
    for (ItemIndex = 0; ItemIndex < (this->FileTable).m_ItemCount; ItemIndex = ItemIndex + 1) {
      pvNewObject = CASC_ARRAY::ItemAt(&this->FileTable,ItemIndex);
      if (pvNewObject != (void *)0x0) {
        if ((this->pNameMap != (PCASC_MAP)0x0) && (*(long *)((long)pvNewObject + 0x10) != 0)) {
          Map_InsertObject(this->pNameMap,pvNewObject,(void *)((long)pvNewObject + 0x10));
        }
        if (this->DataIdOffset != 0) {
          iVar1 = *(int *)((long)pvNewObject + this->DataIdOffset);
          if (iVar1 == -1) {
            bVar3 = DataId != 0xffffffff;
          }
          else {
            _uStack_28 = CONCAT44(iVar1,uStack_28);
            bVar3 = true;
          }
          if ((this->pIdMap != (PCASC_MAP)0x0) && (bVar3)) {
            Map_InsertObject(this->pIdMap,pvNewObject,&DataId);
          }
        }
      }
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool CASC_FILE_TREE::RebuildTreeMaps()
{
    PCASC_FILE_NODE pFileNode;
    size_t nMaxItems = FileTable.ItemCountMax();
    DWORD DataId = 0;

    // Free the map of FullName -> CASC_FILE_NODE
    if(pNameMap != NULL)
        Map_Free(pNameMap);
    pNameMap = NULL;

    // Free the map of DataId -> CASC_FILE_NODE
    if(pIdMap != NULL)
        Map_Free(pIdMap);
    pIdMap = NULL;

    // Create the name map
    pNameMap = Map_Create(nMaxItems, sizeof(ULONGLONG), FIELD_OFFSET(CASC_FILE_NODE, NameHash));
    if(pNameMap == NULL)
        return false;

    // Create the DataId map
    if(DataIdOffset != 0)
    {
        pIdMap = Map_Create(nMaxItems, sizeof(DWORD), DataIdOffset);
        if(pIdMap == NULL)
            return false;
    }

    // Parse all items and insert them to the map
    for(size_t i = 0; i < FileTable.ItemCount(); i++)
    {
        pFileNode = (PCASC_FILE_NODE)FileTable.ItemAt(i);
        if(pFileNode != NULL)
        {
            // Insert the file by name
            if(pNameMap != NULL && pFileNode->NameHash != 0)
                Map_InsertObject(pNameMap, pFileNode, &pFileNode->NameHash);

            // Insert the file by data ID, if supported
            if(DataIdOffset != 0)
            {
                GetExtras(pFileNode, &DataId, NULL, NULL);
                if(pIdMap != NULL && DataId != CASC_INVALID_ID)
                {
                    Map_InsertObject(pIdMap, pFileNode, &DataId);
                }
            }
        }
    }

    return true;
}